

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateObjectAPIExtensionHeader
          (SwiftGenerator *this,string *type_name)

{
  CodeWriter *this_00;
  int *piVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"\n",(allocator<char> *)&local_180);
  this_00 = &this->code_;
  CodeWriter::operator+=(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator+(&local_180,"{{ACCESS_TYPE}} mutating func unpack() -> ",type_name);
  std::operator+(&local_60,&local_180," {");
  CodeWriter::operator+=(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_180);
  piVar1 = &(this->code_).cur_ident_lvl_;
  *piVar1 = *piVar1 + 1;
  std::operator+(&local_180,"return ",type_name);
  std::operator+(&local_80,&local_180,"(&self)");
  CodeWriter::operator+=(this_00,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_180);
  iVar2 = (this->code_).cur_ident_lvl_;
  if (iVar2 != 0) {
    (this->code_).cur_ident_lvl_ = iVar2 + -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"}",(allocator<char> *)&local_180);
  CodeWriter::operator+=(this_00,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::operator+(&local_180,
                 "{{ACCESS_TYPE}} static func pack(_ builder: inout FlatBufferBuilder, obj: inout ",
                 type_name);
  std::operator+(&local_c0,&local_180,"?) -> Offset {");
  CodeWriter::operator+=(this_00,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_180);
  piVar1 = &(this->code_).cur_ident_lvl_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"guard var obj = obj else { return Offset() }",
             (allocator<char> *)&local_180);
  CodeWriter::operator+=(this_00,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"return pack(&builder, obj: &obj)",(allocator<char> *)&local_180);
  CodeWriter::operator+=(this_00,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  iVar2 = (this->code_).cur_ident_lvl_;
  if (iVar2 != 0) {
    (this->code_).cur_ident_lvl_ = iVar2 + -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"}",(allocator<char> *)&local_180);
  CodeWriter::operator+=(this_00,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"",(allocator<char> *)&local_180);
  CodeWriter::operator+=(this_00,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::operator+(&local_180,
                 "{{ACCESS_TYPE}} static func pack(_ builder: inout FlatBufferBuilder, obj: inout ",
                 type_name);
  std::operator+(&local_160,&local_180,") -> Offset {");
  CodeWriter::operator+=(this_00,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  piVar1 = &(this->code_).cur_ident_lvl_;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void GenerateObjectAPIExtensionHeader(std::string type_name) {
    code_ += "\n";
    code_ += "{{ACCESS_TYPE}} mutating func unpack() -> " + type_name + " {";
    Indent();
    code_ += "return " + type_name + "(&self)";
    Outdent();
    code_ += "}";
    code_ +=
        "{{ACCESS_TYPE}} static func pack(_ builder: inout FlatBufferBuilder, "
        "obj: "
        "inout " +
        type_name + "?) -> Offset {";
    Indent();
    code_ += "guard var obj = obj else { return Offset() }";
    code_ += "return pack(&builder, obj: &obj)";
    Outdent();
    code_ += "}";
    code_ += "";
    code_ +=
        "{{ACCESS_TYPE}} static func pack(_ builder: inout FlatBufferBuilder, "
        "obj: "
        "inout " +
        type_name + ") -> Offset {";
    Indent();
  }